

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_operations.hpp
# Opt level: O1

rt_expression_interface<double> *
viennamath::diff_impl<viennamath::rt_expression_interface<double>,double>
          (long *lhs,long *param_2,undefined8 param_3)

{
  rt_expression_interface<double> *prVar1;
  _func_int **pp_Var2;
  _func_int *p_Var3;
  _func_int *p_Var4;
  _func_int *p_Var5;
  _func_int **pp_Var6;
  _func_int **pp_Var7;
  
  prVar1 = (rt_expression_interface<double> *)operator_new(0x20);
  pp_Var2 = (_func_int **)operator_new(0x20);
  p_Var3 = (_func_int *)(**(code **)(*lhs + 0x90))(lhs,param_3);
  p_Var4 = (_func_int *)operator_new(8);
  *(undefined ***)p_Var4 = &PTR__op_interface_0010dc20;
  p_Var5 = (_func_int *)(**(code **)(*param_2 + 0x10))(param_2);
  *pp_Var2 = (_func_int *)&PTR__rt_binary_expr_0010d870;
  pp_Var2[1] = p_Var3;
  pp_Var2[2] = p_Var4;
  pp_Var2[3] = p_Var5;
  pp_Var6 = (_func_int **)operator_new(8);
  *pp_Var6 = (_func_int *)&PTR__op_interface_0010dcb0;
  pp_Var7 = (_func_int **)operator_new(0x20);
  p_Var3 = (_func_int *)(**(code **)(*lhs + 0x10))(lhs);
  p_Var4 = (_func_int *)operator_new(8);
  *(undefined ***)p_Var4 = &PTR__op_interface_0010dc20;
  p_Var5 = (_func_int *)(**(code **)(*param_2 + 0x90))(param_2,param_3);
  *pp_Var7 = (_func_int *)&PTR__rt_binary_expr_0010d870;
  pp_Var7[1] = p_Var3;
  pp_Var7[2] = p_Var4;
  pp_Var7[3] = p_Var5;
  prVar1->_vptr_rt_expression_interface = (_func_int **)&PTR__rt_binary_expr_0010d870;
  prVar1[1]._vptr_rt_expression_interface = pp_Var2;
  prVar1[2]._vptr_rt_expression_interface = pp_Var6;
  prVar1[3]._vptr_rt_expression_interface = pp_Var7;
  return prVar1;
}

Assistant:

InterfaceType * diff_impl(const InterfaceType * lhs, op_mult<NumericT>, const InterfaceType * rhs, const InterfaceType * diff_var)
  {
      return new rt_binary_expr<InterfaceType>( new rt_binary_expr<InterfaceType>(lhs->diff(diff_var),
                                                                                  new op_binary<op_mult<NumericT>, InterfaceType>(),
                                                                                  rhs->clone()),
                                                new op_binary<op_plus<NumericT>, InterfaceType>(),
                                                new rt_binary_expr<InterfaceType>(lhs->clone(),
                                                                                  new op_binary<op_mult<NumericT>, InterfaceType>(),
                                                                                  rhs->diff(diff_var) )
                            );
  }